

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void PPrintSection(TidyDocImpl *doc,uint indent,Node *node)

{
  uint mode;
  uint saveWrap;
  bool bVar1;
  
  bVar1 = *(int *)((doc->config).value + 0x60) == 0;
  mode = 0x10;
  if (bVar1) {
    mode = 2;
  }
  saveWrap = WrapOffCond(doc,(uint)bVar1);
  AddString(&doc->pprint,"<![");
  PPrintText(doc,mode,indent,node);
  AddString(&doc->pprint,"]>");
  WrapOn(doc,saveWrap);
  return;
}

Assistant:

static void PPrintSection( TidyDocImpl* doc, uint indent, Node *node )
{
    TidyPrintImpl* pprint = &doc->pprint;
    Bool wrapSect = cfgBool( doc, TidyWrapSection );
    uint saveWrap = WrapOffCond( doc, !wrapSect  );

    AddString( pprint, "<![" );
    PPrintText( doc, (wrapSect ? CDATA : COMMENT),
                indent, node );
    AddString( pprint, "]>" );

    /* PCondFlushLine( doc, indent ); */
    WrapOn( doc, saveWrap );
}